

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int cert_stuff(connectdata *conn,SSL_CTX *ctx,char *cert_file,char *cert_type,char *key_file,
              char *key_type,char *key_passwd)

{
  bool bVar1;
  undefined8 uVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  X509 *x_00;
  long lVar6;
  OPENSSL_STACK *pOVar7;
  OPENSSL_sk_freefunc p_Var8;
  UI_METHOD *method;
  UI_METHOD *pUVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EVP_PKEY *pEVar10;
  evp_pkey_st *from;
  char *local_220;
  EVP_PKEY *pktmp;
  UI_METHOD *ui_method;
  EVP_PKEY *priv_key;
  X509 *x;
  stack_st_X509 *ca;
  EVP_PKEY *pri;
  PKCS12 *p12;
  FILE *f;
  anon_struct_16_2_531ec2c5 params;
  char *cmd_name;
  X509 *pXStack_160;
  int cert_done;
  X509 *x509;
  SSL *ssl;
  char local_148 [4];
  int file_type;
  char error_buffer [256];
  Curl_easy *data;
  char *key_type_local;
  char *key_file_local;
  char *cert_type_local;
  char *cert_file_local;
  SSL_CTX *ctx_local;
  connectdata *conn_local;
  
  error_buffer._248_8_ = conn->data;
  ssl._4_4_ = do_file_type(cert_type);
  if ((cert_file == (char *)0x0) && (ssl._4_4_ != 0x2a)) {
    return 1;
  }
  bVar1 = false;
  if (key_passwd != (char *)0x0) {
    SSL_CTX_set_default_passwd_cb_userdata((SSL_CTX *)ctx,key_passwd);
    SSL_CTX_set_default_passwd_cb((SSL_CTX *)ctx,passwd_callback);
  }
  if (ssl._4_4_ == 1) {
    iVar3 = SSL_CTX_use_certificate_chain_file((SSL_CTX *)ctx,cert_file);
    uVar2 = error_buffer._248_8_;
    if (iVar3 != 1) {
      uVar4 = ERR_get_error();
      pcVar5 = ossl_strerror(uVar4,local_148,0x100);
      Curl_failf((Curl_easy *)uVar2,
                 "could not load PEM client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
                 ,pcVar5);
      return 0;
    }
  }
  else if (ssl._4_4_ == 2) {
    iVar3 = SSL_CTX_use_certificate_file((SSL_CTX *)ctx,cert_file,2);
    uVar2 = error_buffer._248_8_;
    if (iVar3 != 1) {
      uVar4 = ERR_get_error();
      pcVar5 = ossl_strerror(uVar4,local_148,0x100);
      Curl_failf((Curl_easy *)uVar2,
                 "could not load ASN1 client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
                 ,pcVar5);
      return 0;
    }
  }
  else if (ssl._4_4_ == 0x2a) {
    if (*(long *)(error_buffer._248_8_ + 0x4c28) == 0) {
      Curl_failf((Curl_easy *)error_buffer._248_8_,"crypto engine not set, can\'t load certificate")
      ;
      return 0;
    }
    params.cert = (X509 *)anon_var_dwarf_9c8dd8;
    params.cert_id = (char *)0x0;
    f = (FILE *)cert_file;
    iVar3 = ENGINE_ctrl(*(ENGINE **)(error_buffer._248_8_ + 0x4c28),0xd,0,"LOAD_CERT_CTRL",(f *)0x0)
    ;
    if (iVar3 == 0) {
      Curl_failf((Curl_easy *)error_buffer._248_8_,
                 "ssl engine does not support loading certificates");
      return 0;
    }
    iVar3 = ENGINE_ctrl_cmd(*(ENGINE **)(error_buffer._248_8_ + 0x4c28),(char *)params.cert,0,&f,
                            (f *)0x0,1);
    uVar2 = error_buffer._248_8_;
    if (iVar3 == 0) {
      uVar4 = ERR_get_error();
      pcVar5 = ossl_strerror(uVar4,local_148,0x100);
      Curl_failf((Curl_easy *)uVar2,"ssl engine cannot load client cert with id \'%s\' [%s]",
                 cert_file,pcVar5);
      return 0;
    }
    if (params.cert_id == (char *)0x0) {
      Curl_failf((Curl_easy *)error_buffer._248_8_,
                 "ssl engine didn\'t initialized the certificate properly.");
      return 0;
    }
    iVar3 = SSL_CTX_use_certificate((SSL_CTX *)ctx,(X509 *)params.cert_id);
    if (iVar3 != 1) {
      Curl_failf((Curl_easy *)error_buffer._248_8_,"unable to set client certificate");
      X509_free((X509 *)params.cert_id);
      return 0;
    }
    X509_free((X509 *)params.cert_id);
  }
  else {
    if (ssl._4_4_ != 0x2b) {
      Curl_failf((Curl_easy *)error_buffer._248_8_,"not supported file type \'%s\' for certificate",
                 cert_type);
      return 0;
    }
    x = (X509 *)0x0;
    p12 = (PKCS12 *)fopen64(cert_file,"rb");
    if ((FILE *)p12 == (FILE *)0x0) {
      Curl_failf((Curl_easy *)error_buffer._248_8_,"could not open PKCS12 file \'%s\'",cert_file);
      return 0;
    }
    pri = (EVP_PKEY *)d2i_PKCS12_fp((FILE *)p12,(PKCS12 **)0x0);
    fclose((FILE *)p12);
    if (pri == (EVP_PKEY *)0x0) {
      Curl_failf((Curl_easy *)error_buffer._248_8_,"error reading PKCS12 file \'%s\'",cert_file);
      return 0;
    }
    PKCS12_PBE_add();
    iVar3 = PKCS12_parse((PKCS12 *)pri,key_passwd,(EVP_PKEY **)&ca,&stack0xfffffffffffffea0,
                         (stack_st_X509 **)&x);
    uVar2 = error_buffer._248_8_;
    if (iVar3 == 0) {
      uVar4 = ERR_get_error();
      pcVar5 = ossl_strerror(uVar4,local_148,0x100);
      Curl_failf((Curl_easy *)uVar2,"could not parse PKCS12 file, check password, OpenSSL error %s",
                 pcVar5);
      PKCS12_free((PKCS12 *)pri);
      return 0;
    }
    PKCS12_free((PKCS12 *)pri);
    iVar3 = SSL_CTX_use_certificate((SSL_CTX *)ctx,pXStack_160);
    uVar2 = error_buffer._248_8_;
    if (iVar3 == 1) {
      iVar3 = SSL_CTX_use_PrivateKey((SSL_CTX *)ctx,(EVP_PKEY *)ca);
      if (iVar3 == 1) {
        iVar3 = SSL_CTX_check_private_key((SSL_CTX *)ctx);
        if (iVar3 == 0) {
          Curl_failf((Curl_easy *)error_buffer._248_8_,
                     "private key from PKCS12 file \'%s\' does not match certificate in same file",
                     cert_file);
        }
        else if (x == (X509 *)0x0) {
LAB_009a218e:
          bVar1 = true;
        }
        else {
          do {
            pOVar7 = ossl_check_const_X509_sk_type((stack_st_X509 *)x);
            iVar3 = OPENSSL_sk_num(pOVar7);
            if (iVar3 == 0) goto LAB_009a218e;
            pOVar7 = ossl_check_X509_sk_type((stack_st_X509 *)x);
            x_00 = (X509 *)OPENSSL_sk_pop(pOVar7);
            iVar3 = SSL_CTX_add_client_CA((SSL_CTX *)ctx,x_00);
            if (iVar3 == 0) {
              X509_free(x_00);
              Curl_failf((Curl_easy *)error_buffer._248_8_,
                         "cannot add certificate to client CA list");
              goto LAB_009a2198;
            }
            lVar6 = SSL_CTX_ctrl((SSL_CTX *)ctx,0xe,0,x_00);
          } while (lVar6 != 0);
          X509_free(x_00);
          Curl_failf((Curl_easy *)error_buffer._248_8_,"cannot add certificate to certificate chain"
                    );
        }
      }
      else {
        Curl_failf((Curl_easy *)error_buffer._248_8_,
                   "unable to use private key from PKCS12 file \'%s\'",cert_file);
      }
    }
    else {
      uVar4 = ERR_get_error();
      pcVar5 = ossl_strerror(uVar4,local_148,0x100);
      Curl_failf((Curl_easy *)uVar2,"could not load PKCS12 client certificate, OpenSSL error %s",
                 pcVar5);
    }
LAB_009a2198:
    EVP_PKEY_free((EVP_PKEY *)ca);
    X509_free(pXStack_160);
    pOVar7 = ossl_check_X509_sk_type((stack_st_X509 *)x);
    p_Var8 = ossl_check_X509_freefunc_type(X509_free);
    OPENSSL_sk_pop_free(pOVar7,p_Var8);
    if (!bVar1) {
      return 0;
    }
  }
  ssl._4_4_ = do_file_type(key_type);
  key_type_local = key_file;
  if (ssl._4_4_ == 1) {
    if (bVar1) goto LAB_009a24f0;
    if (key_file == (char *)0x0) {
      key_type_local = cert_file;
    }
  }
  else if (ssl._4_4_ != 2) {
    if (ssl._4_4_ == 0x2a) {
      if (*(long *)(error_buffer._248_8_ + 0x4c28) == 0) {
        Curl_failf((Curl_easy *)error_buffer._248_8_,
                   "crypto engine not set, can\'t load private key");
        return 0;
      }
      method = UI_create_method("curl user interface");
      if (method == (UI_METHOD *)0x0) {
        Curl_failf((Curl_easy *)error_buffer._248_8_,
                   "unable do create OpenSSL user-interface method");
        return 0;
      }
      pUVar9 = UI_OpenSSL();
      iVar3 = UI_method_get_opener((UI *)pUVar9);
      UI_method_set_opener(method,(opener *)CONCAT44(extraout_var,iVar3));
      pUVar9 = UI_OpenSSL();
      iVar3 = UI_method_get_closer((UI *)pUVar9);
      UI_method_set_closer(method,(closer *)CONCAT44(extraout_var_00,iVar3));
      UI_method_set_reader(method,ssl_ui_reader);
      UI_method_set_writer(method,ssl_ui_writer);
      pEVar10 = ENGINE_load_private_key
                          (*(ENGINE **)(error_buffer._248_8_ + 0x4c28),key_file,method,key_passwd);
      UI_destroy_method(method);
      if (pEVar10 == (EVP_PKEY *)0x0) {
        Curl_failf((Curl_easy *)error_buffer._248_8_,"failed to load private key from crypto engine"
                  );
        return 0;
      }
      iVar3 = SSL_CTX_use_PrivateKey((SSL_CTX *)ctx,pEVar10);
      if (iVar3 != 1) {
        Curl_failf((Curl_easy *)error_buffer._248_8_,"unable to set private key");
        EVP_PKEY_free(pEVar10);
        return 0;
      }
      EVP_PKEY_free(pEVar10);
    }
    else {
      if (ssl._4_4_ != 0x2b) {
        Curl_failf((Curl_easy *)error_buffer._248_8_,"not supported file type for private key");
        return 0;
      }
      if (!bVar1) {
        Curl_failf((Curl_easy *)error_buffer._248_8_,"file type P12 for private key not supported");
        return 0;
      }
    }
    goto LAB_009a24f0;
  }
  iVar3 = SSL_CTX_use_PrivateKey_file((SSL_CTX *)ctx,key_type_local,ssl._4_4_);
  if (iVar3 != 1) {
    local_220 = key_type;
    if (key_type == (char *)0x0) {
      local_220 = "PEM";
    }
    Curl_failf((Curl_easy *)error_buffer._248_8_,"unable to set private key file: \'%s\' type %s",
               key_type_local,local_220);
    return 0;
  }
LAB_009a24f0:
  x509 = (X509 *)SSL_new((SSL_CTX *)ctx);
  if ((SSL *)x509 == (SSL *)0x0) {
    Curl_failf((Curl_easy *)error_buffer._248_8_,"unable to create an SSL structure");
    return 0;
  }
  pXStack_160 = SSL_get_certificate((SSL *)x509);
  if (pXStack_160 != (X509 *)0x0) {
    pEVar10 = X509_get_pubkey(pXStack_160);
    from = SSL_get_privatekey((SSL *)x509);
    EVP_PKEY_copy_parameters(pEVar10,from);
    EVP_PKEY_free(pEVar10);
  }
  SSL_free((SSL *)x509);
  iVar3 = SSL_CTX_check_private_key((SSL_CTX *)ctx);
  if (iVar3 != 0) {
    return 1;
  }
  Curl_failf((Curl_easy *)error_buffer._248_8_,
             "Private key does not match the certificate public key");
  return 0;
}

Assistant:

static
int cert_stuff(struct connectdata *conn,
               SSL_CTX* ctx,
               char *cert_file,
               const char *cert_type,
               char *key_file,
               const char *key_type,
               char *key_passwd)
{
  struct Curl_easy *data = conn->data;
  char error_buffer[256];

  int file_type = do_file_type(cert_type);

  if(cert_file || (file_type == SSL_FILETYPE_ENGINE)) {
    SSL *ssl;
    X509 *x509;
    int cert_done = 0;

    if(key_passwd) {
      /* set the password in the callback userdata */
      SSL_CTX_set_default_passwd_cb_userdata(ctx, key_passwd);
      /* Set passwd callback: */
      SSL_CTX_set_default_passwd_cb(ctx, passwd_callback);
    }


    switch(file_type) {
    case SSL_FILETYPE_PEM:
      /* SSL_CTX_use_certificate_chain_file() only works on PEM files */
      if(SSL_CTX_use_certificate_chain_file(ctx,
                                            cert_file) != 1) {
        failf(data,
              "could not load PEM client certificate, " OSSL_PACKAGE
              " error %s, "
              "(no key found, wrong pass phrase, or wrong file format?)",
              ossl_strerror(ERR_get_error(), error_buffer,
                            sizeof(error_buffer)) );
        return 0;
      }
      break;

    case SSL_FILETYPE_ASN1:
      /* SSL_CTX_use_certificate_file() works with either PEM or ASN1, but
         we use the case above for PEM so this can only be performed with
         ASN1 files. */
      if(SSL_CTX_use_certificate_file(ctx,
                                      cert_file,
                                      file_type) != 1) {
        failf(data,
              "could not load ASN1 client certificate, " OSSL_PACKAGE
              " error %s, "
              "(no key found, wrong pass phrase, or wrong file format?)",
              ossl_strerror(ERR_get_error(), error_buffer,
                            sizeof(error_buffer)) );
        return 0;
      }
      break;
    case SSL_FILETYPE_ENGINE:
#if defined(HAVE_OPENSSL_ENGINE_H) && defined(ENGINE_CTRL_GET_CMD_FROM_NAME)
      {
        if(data->state.engine) {
          const char *cmd_name = "LOAD_CERT_CTRL";
          struct {
            const char *cert_id;
            X509 *cert;
          } params;

          params.cert_id = cert_file;
          params.cert = NULL;

          /* Does the engine supports LOAD_CERT_CTRL ? */
          if(!ENGINE_ctrl(data->state.engine, ENGINE_CTRL_GET_CMD_FROM_NAME,
                          0, (void *)cmd_name, NULL)) {
            failf(data, "ssl engine does not support loading certificates");
            return 0;
          }

          /* Load the certificate from the engine */
          if(!ENGINE_ctrl_cmd(data->state.engine, cmd_name,
                              0, &params, NULL, 1)) {
            failf(data, "ssl engine cannot load client cert with id"
                  " '%s' [%s]", cert_file,
                  ossl_strerror(ERR_get_error(), error_buffer,
                                sizeof(error_buffer)));
            return 0;
          }

          if(!params.cert) {
            failf(data, "ssl engine didn't initialized the certificate "
                  "properly.");
            return 0;
          }

          if(SSL_CTX_use_certificate(ctx, params.cert) != 1) {
            failf(data, "unable to set client certificate");
            X509_free(params.cert);
            return 0;
          }
          X509_free(params.cert); /* we don't need the handle any more... */
        }
        else {
          failf(data, "crypto engine not set, can't load certificate");
          return 0;
        }
      }
      break;
#else
      failf(data, "file type ENG for certificate not implemented");
      return 0;
#endif

    case SSL_FILETYPE_PKCS12:
    {
#ifdef HAVE_OPENSSL_PKCS12_H
      FILE *f;
      PKCS12 *p12;
      EVP_PKEY *pri;
      STACK_OF(X509) *ca = NULL;

      f = fopen(cert_file, "rb");
      if(!f) {
        failf(data, "could not open PKCS12 file '%s'", cert_file);
        return 0;
      }
      p12 = d2i_PKCS12_fp(f, NULL);
      fclose(f);

      if(!p12) {
        failf(data, "error reading PKCS12 file '%s'", cert_file);
        return 0;
      }

      PKCS12_PBE_add();

      if(!PKCS12_parse(p12, key_passwd, &pri, &x509,
                       &ca)) {
        failf(data,
              "could not parse PKCS12 file, check password, " OSSL_PACKAGE
              " error %s",
              ossl_strerror(ERR_get_error(), error_buffer,
                            sizeof(error_buffer)) );
        PKCS12_free(p12);
        return 0;
      }

      PKCS12_free(p12);

      if(SSL_CTX_use_certificate(ctx, x509) != 1) {
        failf(data,
              "could not load PKCS12 client certificate, " OSSL_PACKAGE
              " error %s",
              ossl_strerror(ERR_get_error(), error_buffer,
                            sizeof(error_buffer)) );
        goto fail;
      }

      if(SSL_CTX_use_PrivateKey(ctx, pri) != 1) {
        failf(data, "unable to use private key from PKCS12 file '%s'",
              cert_file);
        goto fail;
      }

      if(!SSL_CTX_check_private_key (ctx)) {
        failf(data, "private key from PKCS12 file '%s' "
              "does not match certificate in same file", cert_file);
        goto fail;
      }
      /* Set Certificate Verification chain */
      if(ca) {
        while(sk_X509_num(ca)) {
          /*
           * Note that sk_X509_pop() is used below to make sure the cert is
           * removed from the stack properly before getting passed to
           * SSL_CTX_add_extra_chain_cert(), which takes ownership. Previously
           * we used sk_X509_value() instead, but then we'd clean it in the
           * subsequent sk_X509_pop_free() call.
           */
          X509 *x = sk_X509_pop(ca);
          if(!SSL_CTX_add_client_CA(ctx, x)) {
            X509_free(x);
            failf(data, "cannot add certificate to client CA list");
            goto fail;
          }
          if(!SSL_CTX_add_extra_chain_cert(ctx, x)) {
            X509_free(x);
            failf(data, "cannot add certificate to certificate chain");
            goto fail;
          }
        }
      }

      cert_done = 1;
  fail:
      EVP_PKEY_free(pri);
      X509_free(x509);
      sk_X509_pop_free(ca, X509_free);

      if(!cert_done)
        return 0; /* failure! */
      break;
#else
      failf(data, "file type P12 for certificate not supported");
      return 0;
#endif
    }
    default:
      failf(data, "not supported file type '%s' for certificate", cert_type);
      return 0;
    }

    file_type = do_file_type(key_type);

    switch(file_type) {
    case SSL_FILETYPE_PEM:
      if(cert_done)
        break;
      if(!key_file)
        /* cert & key can only be in PEM case in the same file */
        key_file=cert_file;
      /* FALLTHROUGH */
    case SSL_FILETYPE_ASN1:
      if(SSL_CTX_use_PrivateKey_file(ctx, key_file, file_type) != 1) {
        failf(data, "unable to set private key file: '%s' type %s",
              key_file, key_type?key_type:"PEM");
        return 0;
      }
      break;
    case SSL_FILETYPE_ENGINE:
#ifdef HAVE_OPENSSL_ENGINE_H
      {                         /* XXXX still needs some work */
        EVP_PKEY *priv_key = NULL;
        if(data->state.engine) {
          UI_METHOD *ui_method =
            UI_create_method((char *)"curl user interface");
          if(!ui_method) {
            failf(data, "unable do create " OSSL_PACKAGE
                  " user-interface method");
            return 0;
          }
          UI_method_set_opener(ui_method, UI_method_get_opener(UI_OpenSSL()));
          UI_method_set_closer(ui_method, UI_method_get_closer(UI_OpenSSL()));
          UI_method_set_reader(ui_method, ssl_ui_reader);
          UI_method_set_writer(ui_method, ssl_ui_writer);
          /* the typecast below was added to please mingw32 */
          priv_key = (EVP_PKEY *)
            ENGINE_load_private_key(data->state.engine, key_file,
                                    ui_method,
                                    key_passwd);
          UI_destroy_method(ui_method);
          if(!priv_key) {
            failf(data, "failed to load private key from crypto engine");
            return 0;
          }
          if(SSL_CTX_use_PrivateKey(ctx, priv_key) != 1) {
            failf(data, "unable to set private key");
            EVP_PKEY_free(priv_key);
            return 0;
          }
          EVP_PKEY_free(priv_key);  /* we don't need the handle any more... */
        }
        else {
          failf(data, "crypto engine not set, can't load private key");
          return 0;
        }
      }
      break;
#else
      failf(data, "file type ENG for private key not supported");
      return 0;
#endif
    case SSL_FILETYPE_PKCS12:
      if(!cert_done) {
        failf(data, "file type P12 for private key not supported");
        return 0;
      }
      break;
    default:
      failf(data, "not supported file type for private key");
      return 0;
    }

    ssl=SSL_new(ctx);
    if(!ssl) {
      failf(data, "unable to create an SSL structure");
      return 0;
    }

    x509=SSL_get_certificate(ssl);

    /* This version was provided by Evan Jordan and is supposed to not
       leak memory as the previous version: */
    if(x509) {
      EVP_PKEY *pktmp = X509_get_pubkey(x509);
      EVP_PKEY_copy_parameters(pktmp, SSL_get_privatekey(ssl));
      EVP_PKEY_free(pktmp);
    }

    SSL_free(ssl);

    /* If we are using DSA, we can copy the parameters from
     * the private key */


    /* Now we know that a key and cert have been set against
     * the SSL context */
    if(!SSL_CTX_check_private_key(ctx)) {
      failf(data, "Private key does not match the certificate public key");
      return 0;
    }
  }
  return 1;
}